

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edk2_ftw.cpp
# Opt level: O0

void __thiscall edk2_ftw_t::_read(edk2_ftw_t *this)

{
  kstream *pkVar1;
  uint8_t uVar2;
  uint32_t uVar3;
  int iVar4;
  uint32_t uVar5;
  string local_90;
  string local_70;
  string local_50;
  string local_30;
  edk2_ftw_t *local_10;
  edk2_ftw_t *this_local;
  
  local_10 = this;
  kaitai::kstream::read_bytes_abi_cxx11_(&local_30,(this->super_kstruct).m__io,0x10);
  std::__cxx11::string::operator=((string *)&this->m_signature,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  uVar3 = kaitai::kstream::read_u4le((this->super_kstruct).m__io);
  this->m_crc = uVar3;
  uVar2 = kaitai::kstream::read_u1((this->super_kstruct).m__io);
  this->m_state = uVar2;
  kaitai::kstream::read_bytes_abi_cxx11_(&local_50,(this->super_kstruct).m__io,3);
  std::__cxx11::string::operator=((string *)&this->m_reserved,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  uVar3 = kaitai::kstream::read_u4le((this->super_kstruct).m__io);
  this->m_len_write_queue_32 = uVar3;
  this->n_len_write_queue_64 = true;
  uVar3 = len_write_queue_32(this);
  iVar4 = kaitai::kstream::mod(uVar3,0x10);
  if (iVar4 == 0) {
    this->n_len_write_queue_64 = false;
    uVar3 = kaitai::kstream::read_u4le((this->super_kstruct).m__io);
    this->m_len_write_queue_64 = uVar3;
  }
  this->n_write_queue_32 = true;
  uVar3 = len_write_queue_32(this);
  iVar4 = kaitai::kstream::mod(uVar3,0x10);
  if (iVar4 == 4) {
    this->n_write_queue_32 = false;
    pkVar1 = (this->super_kstruct).m__io;
    uVar3 = len_write_queue_32(this);
    kaitai::kstream::read_bytes_abi_cxx11_(&local_70,pkVar1,(ulong)uVar3);
    std::__cxx11::string::operator=((string *)&this->m_write_queue_32,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
  }
  this->n_write_queue_64 = true;
  uVar3 = len_write_queue_32(this);
  iVar4 = kaitai::kstream::mod(uVar3,0x10);
  if (iVar4 == 0) {
    this->n_write_queue_64 = false;
    pkVar1 = (this->super_kstruct).m__io;
    uVar3 = len_write_queue_64(this);
    uVar5 = len_write_queue_32(this);
    kaitai::kstream::read_bytes_abi_cxx11_(&local_90,pkVar1,CONCAT44(uVar3,uVar5));
    std::__cxx11::string::operator=((string *)&this->m_write_queue_64,(string *)&local_90);
    std::__cxx11::string::~string((string *)&local_90);
  }
  return;
}

Assistant:

void edk2_ftw_t::_read() {
    m_signature = m__io->read_bytes(16);
    m_crc = m__io->read_u4le();
    m_state = m__io->read_u1();
    m_reserved = m__io->read_bytes(3);
    m_len_write_queue_32 = m__io->read_u4le();
    n_len_write_queue_64 = true;
    if (kaitai::kstream::mod(len_write_queue_32(), 16) == 0) {
        n_len_write_queue_64 = false;
        m_len_write_queue_64 = m__io->read_u4le();
    }
    n_write_queue_32 = true;
    if (kaitai::kstream::mod(len_write_queue_32(), 16) == 4) {
        n_write_queue_32 = false;
        m_write_queue_32 = m__io->read_bytes(len_write_queue_32());
    }
    n_write_queue_64 = true;
    if (kaitai::kstream::mod(len_write_queue_32(), 16) == 0) {
        n_write_queue_64 = false;
        m_write_queue_64 = m__io->read_bytes(((static_cast<uint64_t>(len_write_queue_64()) << 32) + len_write_queue_32()));
    }
}